

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_arithmetic(void)

{
  pointer pCVar1;
  double dVar2;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  unique_ptr<Calc,_std::default_delete<Calc>_> local_10;
  unique_ptr<Calc,_std::default_delete<Calc>_> calc;
  
  DefaultCalc();
  pCVar1 = std::unique_ptr<Calc,_std::default_delete<Calc>_>::operator->(&local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"5 1 2 + 4 * + 3 -",&local_31);
  dVar2 = Calc::eval(pCVar1,&local_30);
  AssertEqD(dVar2,14.0,0x3a);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pCVar1 = std::unique_ptr<Calc,_std::default_delete<Calc>_>::operator->(&local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"15 7 1 1 + - / 3 * 2 1 1 + + -",&local_69);
  dVar2 = Calc::eval(pCVar1,&local_68);
  AssertEqD(dVar2,5.0,0x3c);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::unique_ptr<Calc,_std::default_delete<Calc>_>::~unique_ptr(&local_10);
  return;
}

Assistant:

void test_arithmetic() {
  auto calc = DefaultCalc();
  AssertEqD(calc->eval("5 1 2 + 4 * + 3 -"), 14.0, __LINE__);
  // 15 7 1 1 + - / 3 * 2 1 1 + + 1
  AssertEqD(calc->eval("15 7 1 1 + - / 3 * 2 1 1 + + -"), 5.0, __LINE__);
}